

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O3

void __thiscall soplex::SPxBasisBase<double>::Desc::Desc(Desc *this,Desc *old)

{
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *this_00;
  Desc *pDVar1;
  Desc *pDVar2;
  
  DataArray<soplex::SPxBasisBase<double>::Desc::Status>::DataArray(&this->rowstat,&old->rowstat);
  this_00 = &this->colstat;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status>::DataArray(this_00,&old->colstat);
  pDVar2 = (Desc *)this_00;
  pDVar1 = this;
  if ((Desc *)old->stat != old) {
    pDVar2 = this;
    pDVar1 = (Desc *)this_00;
  }
  this->stat = &pDVar1->rowstat;
  this->costat = &pDVar2->rowstat;
  return;
}

Assistant:

SPxBasisBase<R>::Desc::Desc(const Desc& old)
   : rowstat(old.rowstat)
   , colstat(old.colstat)
{
   if(old.stat == &old.rowstat)
   {
      assert(old.costat == &old.colstat);

      stat   = &rowstat;
      costat = &colstat;
   }
   else
   {
      assert(old.costat == &old.rowstat);

      stat   = &colstat;
      costat = &rowstat;
   }

   assert(Desc::isConsistent());
}